

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

SQRESULT sq_setconsttable(HSQUIRRELVM v)

{
  SQObjectPtr *pSVar1;
  SQObjectPtr *in_RDI;
  SQObject o;
  SQChar *in_stack_ffffffffffffffd8;
  HSQUIRRELVM in_stack_ffffffffffffffe0;
  SQRESULT local_8;
  
  pSVar1 = stack_get(in_stack_ffffffffffffffe0,(SQInteger)in_stack_ffffffffffffffd8);
  if ((int)*(HSQUIRRELVM *)&pSVar1->super_SQObject == 0xa000020) {
    SQObjectPtr::operator=(in_RDI,(SQObject *)(pSVar1->super_SQObject)._unVal.pTable);
    SQVM::Pop((SQVM *)0x117739);
    local_8 = 0;
  }
  else {
    local_8 = sq_throwerror(*(HSQUIRRELVM *)&pSVar1->super_SQObject,in_stack_ffffffffffffffd8);
  }
  return local_8;
}

Assistant:

SQRESULT sq_setconsttable(HSQUIRRELVM v)
{
    SQObject o = stack_get(v, -1);
    if(sq_istable(o)) {
        _ss(v)->_consts = o;
        v->Pop();
        return SQ_OK;
    }
    return sq_throwerror(v, _SC("invalid type, expected table"));
}